

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void perfetto::internal::TrackRegistry::InitializeInstance(void)

{
  PlatformProcessId data;
  TrackRegistry *this;
  array<unsigned_char,_16UL> local_38;
  Hash local_28;
  Hash hash;
  uint64_t start_time;
  
  if (instance_ == (TrackRegistry *)0x0) {
    this = (TrackRegistry *)operator_new(0x58);
    TrackRegistry(this);
    instance_ = this;
    hash.result_ = anon_unknown_17::GetProcessStartTime();
    if (hash.result_ == 0) {
      local_38._M_elems = (_Type)perfetto::base::Uuidv4();
      Track::process_uuid = perfetto::base::Uuid::lsb((Uuid *)&local_38);
    }
    else {
      perfetto::base::Hash::Hash(&local_28);
      perfetto::base::Hash::Update<unsigned_long,_true>(&local_28,hash.result_);
      data = Platform::GetCurrentProcessId();
      perfetto::base::Hash::Update<int,_true>(&local_28,data);
      Track::process_uuid = perfetto::base::Hash::digest(&local_28);
    }
  }
  return;
}

Assistant:

void TrackRegistry::InitializeInstance() {
  // TODO(eseckler): Chrome may call this more than once. Once Chrome doesn't
  // call this directly anymore, bring back DCHECK(!instance_) instead.
  if (instance_)
    return;
  instance_ = new TrackRegistry();

  // Use the process start time + pid as the unique identifier for this process.
  // This ensures that if there are two independent copies of the Perfetto SDK
  // in the same process (e.g., one in the app and another in a system
  // framework), events emitted by each will be consistently interleaved on
  // common thread and process tracks.
  if (uint64_t start_time = GetProcessStartTime()) {
    base::Hash hash;
    hash.Update(start_time);
    hash.Update(Platform::GetCurrentProcessId());
    Track::process_uuid = hash.digest();
  } else {
    // Fall back to a randomly generated identifier.
    Track::process_uuid = static_cast<uint64_t>(base::Uuidv4().lsb());
  }
}